

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O2

void QuackFunction::QuackFunc(ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  FunctionData *pFVar1;
  GlobalTableFunctionState *pGVar2;
  ulong uVar3;
  ulong uVar4;
  Value *pVVar5;
  Value local_70 [64];
  
  pFVar1 = duckdb::optional_ptr<const_duckdb::FunctionData,_true>::operator->
                     ((optional_ptr<const_duckdb::FunctionData,_true> *)data_p);
  pGVar2 = duckdb::optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator*
                     ((optional_ptr<duckdb::GlobalTableFunctionState,_true> *)(data_p + 0x10));
  uVar3 = *(ulong *)(pGVar2 + 8);
  uVar4 = *(ulong *)(pFVar1 + 0x20);
  if (uVar3 < uVar4) {
    for (pVVar5 = (Value *)0x0; (uVar3 < uVar4 && (pVVar5 < (Value *)0x800)); pVVar5 = pVVar5 + 1) {
      duckdb::Value::Value(local_70,"QUACK");
      duckdb::DataChunk::SetValue((ulong)output,0,pVVar5);
      duckdb::Value::~Value(local_70);
      uVar3 = *(long *)(pGVar2 + 8) + 1;
      *(ulong *)(pGVar2 + 8) = uVar3;
      uVar4 = *(ulong *)(pFVar1 + 0x20);
    }
    *(Value **)(output + 0x18) = pVVar5;
  }
  return;
}

Assistant:

static void QuackFunc(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
		auto &bind_data = data_p.bind_data->Cast<QuackBindData>();
		auto &data = (QuackGlobalData &)*data_p.global_state;
		if (data.offset >= bind_data.number_of_quacks) {
			// finished returning values
			return;
		}
		// start returning values
		// either fill up the chunk or return all the remaining columns
		idx_t count = 0;
		while (data.offset < bind_data.number_of_quacks && count < STANDARD_VECTOR_SIZE) {
			output.SetValue(0, count, Value("QUACK"));
			data.offset++;
			count++;
		}
		output.SetCardinality(count);
	}